

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O2

void google::protobuf::util::anon_unknown_0::ConvertOptionField
               (Reflection *reflection,Message *options,FieldDescriptor *field,int index,Option *out
               )

{
  int iVar1;
  bool bVar2;
  int32_t iVar3;
  uint32_t uVar4;
  Any *this;
  Message *message;
  uint64_t uVar5;
  EnumValueDescriptor *pEVar6;
  size_type sVar7;
  Arena *arena;
  string *this_00;
  float fVar8;
  Int32Value wrapper;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  double local_90;
  undefined1 local_88 [32];
  string local_68;
  string local_48;
  
  arena = (Arena *)(out->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>
            (&(out->field_0)._impl_.name_,
             (string *)
             ((long)&(field->all_names_->_M_dataplus)._M_p +
             (ulong)(((byte)field->field_0x1 & 8) << 2)),arena);
  this = Option::mutable_value(out);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      iVar3 = Reflection::GetRepeatedInt32(reflection,options,field,index);
    }
    else {
      iVar3 = Reflection::GetInt32(reflection,options,field);
    }
    Int32Value::Int32Value((Int32Value *)local_b0);
    local_a0._M_allocated_capacity._0_4_ = iVar3;
    Any::PackFrom(this,(Message *)local_b0);
    goto LAB_002ea8ae;
  case 2:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      sVar7 = Reflection::GetRepeatedInt64(reflection,options,field,index);
    }
    else {
      sVar7 = Reflection::GetInt64(reflection,options,field);
    }
    Int64Value::Int64Value((Int64Value *)local_b0);
    local_a0._M_allocated_capacity = sVar7;
    Any::PackFrom(this,(Message *)local_b0);
    Int64Value::~Int64Value((Int64Value *)local_b0);
    break;
  case 3:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      uVar4 = Reflection::GetRepeatedUInt32(reflection,options,field,index);
    }
    else {
      uVar4 = Reflection::GetUInt32(reflection,options,field);
    }
    UInt32Value::UInt32Value((UInt32Value *)local_b0);
    local_a0._M_allocated_capacity._0_4_ = uVar4;
    Any::PackFrom(this,(Message *)local_b0);
    UInt32Value::~UInt32Value((UInt32Value *)local_b0);
    break;
  case 4:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      uVar5 = Reflection::GetRepeatedUInt64(reflection,options,field,index);
    }
    else {
      uVar5 = Reflection::GetUInt64(reflection,options,field);
    }
    UInt64Value::UInt64Value((UInt64Value *)local_b0);
    local_a0._M_allocated_capacity = uVar5;
    Any::PackFrom(this,(Message *)local_b0);
    UInt64Value::~UInt64Value((UInt64Value *)local_b0);
    break;
  case 5:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      local_90 = Reflection::GetRepeatedDouble(reflection,options,field,index);
    }
    else {
      local_90 = Reflection::GetDouble(reflection,options,field);
    }
    DoubleValue::DoubleValue((DoubleValue *)local_b0);
    local_a0._M_allocated_capacity = (size_type)local_90;
    Any::PackFrom(this,(Message *)local_b0);
    DoubleValue::~DoubleValue((DoubleValue *)local_b0);
    break;
  case 6:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      fVar8 = Reflection::GetRepeatedFloat(reflection,options,field,index);
    }
    else {
      fVar8 = Reflection::GetFloat(reflection,options,field);
    }
    local_90 = (double)CONCAT44(local_90._4_4_,fVar8);
    FloatValue::FloatValue((FloatValue *)local_b0);
    local_a0._M_allocated_capacity._0_4_ = local_90._0_4_;
    Any::PackFrom(this,(Message *)local_b0);
    FloatValue::~FloatValue((FloatValue *)local_b0);
    break;
  case 7:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      bVar2 = Reflection::GetRepeatedBool(reflection,options,field,index);
    }
    else {
      bVar2 = Reflection::GetBool(reflection,options,field);
    }
    BoolValue::BoolValue((BoolValue *)local_b0);
    local_a0._M_local_buf[0] = bVar2;
    Any::PackFrom(this,(Message *)local_b0);
    BoolValue::~BoolValue((BoolValue *)local_b0);
    break;
  case 8:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      pEVar6 = Reflection::GetRepeatedEnum(reflection,options,field,index);
    }
    else {
      pEVar6 = Reflection::GetEnum(reflection,options,field);
    }
    iVar1 = pEVar6->number_;
    Int32Value::Int32Value((Int32Value *)local_b0);
    local_a0._M_allocated_capacity._0_4_ = iVar1;
    Any::PackFrom(this,(Message *)local_b0);
LAB_002ea8ae:
    Int32Value::~Int32Value((Int32Value *)local_b0);
    break;
  case 9:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      Reflection::GetRepeatedString_abi_cxx11_((string *)local_b0,reflection,options,field,index);
    }
    else {
      Reflection::GetString_abi_cxx11_((string *)local_b0,reflection,options,field);
    }
    if (field->type_ == '\t') {
      std::__cxx11::string::string((string *)&local_48,(string *)local_b0);
      StringValue::StringValue((StringValue *)local_88);
      if ((local_88._8_8_ & 1) != 0) {
        local_88._8_8_ = *(undefined8 *)(local_88._8_8_ & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)(local_88 + 0x10),&local_48,(Arena *)local_88._8_8_);
      Any::PackFrom(this,(Message *)local_88);
      StringValue::~StringValue((StringValue *)local_88);
      this_00 = &local_48;
    }
    else {
      std::__cxx11::string::string((string *)&local_68,(string *)local_b0);
      BytesValue::BytesValue((BytesValue *)local_88);
      if ((local_88._8_8_ & 1) != 0) {
        local_88._8_8_ = *(undefined8 *)(local_88._8_8_ & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)(local_88 + 0x10),&local_68,(Arena *)local_88._8_8_);
      Any::PackFrom(this,(Message *)local_88);
      BytesValue::~BytesValue((BytesValue *)local_88);
      this_00 = &local_68;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::~string((string *)local_b0);
    break;
  case 10:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      message = Reflection::GetRepeatedMessage(reflection,options,field,index);
    }
    else {
      message = Reflection::GetMessage(reflection,options,field,(MessageFactory *)0x0);
    }
    Any::PackFrom(this,message);
    return;
  }
  return;
}

Assistant:

void ConvertOptionField(const Reflection* reflection, const Message& options,
                        const FieldDescriptor* field, int index, Option* out) {
  out->set_name(field->is_extension() ? field->full_name() : field->name());
  Any* value = out->mutable_value();
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_MESSAGE:
      value->PackFrom(
          field->is_repeated()
              ? reflection->GetRepeatedMessage(options, field, index)
              : reflection->GetMessage(options, field));
      return;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      value->PackFrom(WrapValue<DoubleValue>(
          field->is_repeated()
              ? reflection->GetRepeatedDouble(options, field, index)
              : reflection->GetDouble(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_FLOAT:
      value->PackFrom(WrapValue<FloatValue>(
          field->is_repeated()
              ? reflection->GetRepeatedFloat(options, field, index)
              : reflection->GetFloat(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      value->PackFrom(WrapValue<Int64Value>(
          field->is_repeated()
              ? reflection->GetRepeatedInt64(options, field, index)
              : reflection->GetInt64(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      value->PackFrom(WrapValue<UInt64Value>(
          field->is_repeated()
              ? reflection->GetRepeatedUInt64(options, field, index)
              : reflection->GetUInt64(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      value->PackFrom(WrapValue<Int32Value>(
          field->is_repeated()
              ? reflection->GetRepeatedInt32(options, field, index)
              : reflection->GetInt32(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      value->PackFrom(WrapValue<UInt32Value>(
          field->is_repeated()
              ? reflection->GetRepeatedUInt32(options, field, index)
              : reflection->GetUInt32(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      value->PackFrom(WrapValue<BoolValue>(
          field->is_repeated()
              ? reflection->GetRepeatedBool(options, field, index)
              : reflection->GetBool(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_STRING: {
      const std::string& val =
          field->is_repeated()
              ? reflection->GetRepeatedString(options, field, index)
              : reflection->GetString(options, field);
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        value->PackFrom(WrapValue<StringValue>(val));
      } else {
        value->PackFrom(WrapValue<BytesValue>(val));
      }
      return;
    }
    case FieldDescriptor::CPPTYPE_ENUM: {
      const EnumValueDescriptor* val =
          field->is_repeated()
              ? reflection->GetRepeatedEnum(options, field, index)
              : reflection->GetEnum(options, field);
      value->PackFrom(WrapValue<Int32Value>(val->number()));
      return;
    }
  }
}